

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::handleRotations(QPDFJob *this,QPDF *pdf)

{
  pointer *this_00;
  bool bVar1;
  element_type *peVar2;
  reference ppVar3;
  char *range_00;
  reference piVar4;
  size_t __n;
  reference this_01;
  int local_d0;
  int local_cc;
  int pageno;
  int pageno_iter;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  RotationSpec *rspec;
  string *range;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>
  *iter;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>_>
  *__range1;
  int local_60;
  int npages;
  undefined1 local_50 [8];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  QPDFPageDocumentHelper dh;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  this_00 = &pages.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)this_00,pdf);
  QPDFPageDocumentHelper::getAllPages
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_50,
             (QPDFPageDocumentHelper *)this_00);
  __range1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>_>
              *)std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size
                          ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                           local_50);
  local_60 = QIntC::to_int<unsigned_long>((unsigned_long *)&__range1);
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>_>
           ::begin(&peVar2->rotations);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>_>
            ::end(&peVar2->rotations);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&iter);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>
             ::operator*(&__end1);
    range_00 = (char *)std::__cxx11::string::c_str();
    QUtil::parse_numrange((vector<int,_std::allocator<int>_> *)&__begin2,range_00,local_60);
    __end2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)&__begin2);
    _pageno = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)&__begin2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&pageno);
      if (!bVar1) break;
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_cc = *piVar4;
      local_d0 = local_cc + -1;
      if ((-1 < local_d0) && (local_d0 < local_60)) {
        __n = QIntC::to_size<int>(&local_d0);
        this_01 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)
                             local_50,__n);
        QPDFPageObjectHelper::rotatePage
                  (this_01,(ppVar3->second).angle,(bool)((ppVar3->second).relative & 1));
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&__begin2);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFJob::RotationSpec>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_50);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)
             &pages.super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void
QPDFJob::handleRotations(QPDF& pdf)
{
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> pages = dh.getAllPages();
    int npages = QIntC::to_int(pages.size());
    for (auto const& iter: m->rotations) {
        std::string const& range = iter.first;
        QPDFJob::RotationSpec const& rspec = iter.second;
        // range has been previously validated
        for (int pageno_iter: QUtil::parse_numrange(range.c_str(), npages)) {
            int pageno = pageno_iter - 1;
            if ((pageno >= 0) && (pageno < npages)) {
                pages.at(QIntC::to_size(pageno)).rotatePage(rspec.angle, rspec.relative);
            }
        }
    }
}